

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

boolean decode_mcu_DC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  JBLOCKROW paJVar3;
  boolean bVar4;
  undefined1 local_70 [8];
  bitread_working_state br_state;
  _func_void_j_decompress_ptr *p_Stack_40;
  int bits_left;
  bit_buf_type get_buffer;
  JBLOCKROW block;
  int blkn;
  int p1;
  huff_entropy_ptr entropy;
  JBLOCKROW *MCU_data_local;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->entropy;
  iVar1 = cinfo->Al;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar2[3].decode_mcu != 0)) ||
     (bVar4 = process_restart(cinfo), bVar4 != 0)) {
    local_70 = (undefined1  [8])cinfo->src->next_input_byte;
    br_state.next_input_byte = (JOCTET *)cinfo->src->bytes_in_buffer;
    p_Stack_40 = pjVar2[1].start_pass;
    br_state.cinfo._4_4_ = *(int *)&pjVar2[1].decode_mcu;
    br_state._24_8_ = cinfo;
    for (block._0_4_ = 0; (int)block < cinfo->blocks_in_MCU; block._0_4_ = (int)block + 1) {
      paJVar3 = MCU_data[(int)block];
      if (br_state.cinfo._4_4_ < 1) {
        bVar4 = jpeg_fill_bit_buffer
                          ((bitread_working_state *)local_70,(bit_buf_type)p_Stack_40,
                           br_state.cinfo._4_4_,1);
        if (bVar4 == 0) {
          return 0;
        }
        p_Stack_40 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
        br_state.cinfo._4_4_ = (int)br_state.get_buffer;
      }
      br_state.cinfo._4_4_ = br_state.cinfo._4_4_ + -1;
      if (((long)p_Stack_40 >> ((byte)br_state.cinfo._4_4_ & 0x3f) & (ulong)1) != 0) {
        (*paJVar3)[0] = (*paJVar3)[0] | (ushort)(1 << ((byte)iVar1 & 0x1f));
      }
    }
    cinfo->src->next_input_byte = (JOCTET *)local_70;
    cinfo->src->bytes_in_buffer = (size_t)br_state.next_input_byte;
    pjVar2[1].start_pass = p_Stack_40;
    *(int *)&pjVar2[1].decode_mcu = br_state.cinfo._4_4_;
    *(int *)&pjVar2[3].decode_mcu = *(int *)&pjVar2[3].decode_mcu + -1;
    cinfo_local._4_4_ = 1;
  }
  else {
    cinfo_local._4_4_ = 0;
  }
  return cinfo_local._4_4_;
}

Assistant:

METHODDEF(boolean)
decode_mcu_DC_refine (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  unsigned char *st;
  int p1, blkn;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  st = entropy->fixed_bin;	/* use fixed probability estimation */
  p1 = 1 << cinfo->Al;		/* 1 in the bit position being coded */

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    /* Encoded data is simply the next bit of the two's-complement DC value */
    if (arith_decode(cinfo, st))
      MCU_data[blkn][0][0] |= p1;
  }

  return TRUE;
}